

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnSurfaceProjection.h
# Opt level: O0

ParameterPoint * __thiscall
anurbs::PointOnSurfaceProjection<3L>::triangle_projection
          (ParameterPoint *__return_storage_ptr__,PointOnSurfaceProjection<3L> *this,Vector *point,
          size_t *index_a,size_t *index_b,size_t *index_c)

{
  reference pvVar1;
  element_type *peVar2;
  double dVar3;
  double dVar4;
  undefined1 local_258 [8];
  Vector closest_point;
  double parameter_v;
  double parameter_u;
  double alp;
  Matrix<double,_1,_3,_1,_1,_3> local_210;
  Vector<3> local_1f8;
  double local_1e0;
  double bet;
  Matrix<double,_1,_3,_1,_1,_3> local_1c0;
  Vector<3> local_1a8;
  double local_190;
  double gam;
  undefined1 local_170 [8];
  Vector w;
  Matrix<double,_1,_3,_1,_1,_3> local_140;
  undefined1 local_128 [8];
  Vector n;
  undefined1 local_f8 [8];
  Vector v;
  undefined1 local_c8 [8];
  Vector u;
  value_type c;
  value_type b;
  value_type a;
  size_t *index_c_local;
  size_t *index_b_local;
  size_t *index_a_local;
  Vector *point_local;
  PointOnSurfaceProjection<3L> *this_local;
  
  a.point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] =
       (double)index_c;
  pvVar1 = std::
           vector<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
           ::operator[](&this->m_tessellation,*index_a);
  ParameterPoint::ParameterPoint
            ((ParameterPoint *)
             (b.point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2),pvVar1);
  pvVar1 = std::
           vector<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
           ::operator[](&this->m_tessellation,*index_b);
  ParameterPoint::ParameterPoint
            ((ParameterPoint *)
             (c.point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
              array + 2),pvVar1);
  pvVar1 = std::
           vector<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
           ::operator[](&this->m_tessellation,
                        *(size_type *)
                         a.point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                         m_storage.m_data.array[2]);
  ParameterPoint::ParameterPoint
            ((ParameterPoint *)
             (u.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
             + 2),pvVar1);
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)(v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                 array + 2),(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&b.parameter_v,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&a.parameter_v);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((Matrix<double,1,3,1,1,3> *)local_c8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)(v.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                 array + 2));
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)(n.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                 array + 2),(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)&c.parameter_v,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&a.parameter_v);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((Matrix<double,1,3,1,1,3> *)local_f8,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)(n.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
                 array + 2));
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_140,(Matrix<double,_1,_3,_1,_1,_3> *)local_c8)
  ;
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            ((Matrix<double,_1,_3,_1,_1,_3> *)
             (w.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
             + 2),(Matrix<double,_1,_3,_1,_1,_3> *)local_f8);
  cross((Vector<3> *)local_128,&local_140,
        (Vector<3> *)
        (w.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array + 2))
  ;
  Eigen::MatrixBase<Eigen::Matrix<double,1,3,1,1,3>>::operator-
            ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>
              *)&gam,(MatrixBase<Eigen::Matrix<double,1,3,1,1,3>> *)point,
             (MatrixBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)&a.parameter_v);
  Eigen::Matrix<double,1,3,1,1,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
            ((Matrix<double,1,3,1,1,3> *)local_170,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
              *)&gam);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix(&local_1c0,(Matrix<double,_1,_3,_1,_1,_3> *)local_c8)
  ;
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            ((Matrix<double,_1,_3,_1,_1,_3> *)&bet,(Matrix<double,_1,_3,_1,_1,_3> *)local_170);
  cross(&local_1a8,&local_1c0,(Vector<3> *)&bet);
  dVar3 = dot(&local_1a8,(Vector<3> *)local_128);
  local_190 = squared_norm((Vector<3> *)local_128);
  local_190 = dVar3 / local_190;
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            (&local_210,(Matrix<double,_1,_3,_1,_1,_3> *)local_170);
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            ((Matrix<double,_1,_3,_1,_1,_3> *)&alp,(Matrix<double,_1,_3,_1,_1,_3> *)local_f8);
  cross(&local_1f8,&local_210,(Vector<3> *)&alp);
  dVar3 = dot(&local_1f8,(Vector<3> *)local_128);
  local_1e0 = squared_norm((Vector<3> *)local_128);
  local_1e0 = dVar3 / local_1e0;
  dVar3 = (1.0 - local_190) - local_1e0;
  dVar4 = local_190 *
          u.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array[2] +
          dVar3 * b.point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                  m_data.array[2] +
          local_1e0 *
          c.point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[2];
  closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
  [2] = local_190 * c.parameter_u + dVar3 * a.parameter_u + local_1e0 * b.parameter_u;
  peVar2 = std::
           __shared_ptr_access<anurbs::SurfaceBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<anurbs::SurfaceBase<3L>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  (*peVar2->_vptr_SurfaceBase[6])
            (dVar4,closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                   m_storage.m_data.array[2],local_258);
  __return_storage_ptr__->parameter_u = dVar4;
  __return_storage_ptr__->parameter_v =
       closest_point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
       array[2];
  Eigen::Matrix<double,_1,_3,_1,_1,_3>::Matrix
            (&__return_storage_ptr__->point,(Matrix<double,_1,_3,_1,_1,_3> *)local_258);
  return __return_storage_ptr__;
}

Assistant:

ParameterPoint triangle_projection(const Vector point,
        const size_t& index_a, const size_t& index_b, const size_t& index_c)
    {
        const auto a = m_tessellation[index_a];
        const auto b = m_tessellation[index_b];
        const auto c = m_tessellation[index_c];

        const Vector u = b.point - a.point;
        const Vector v = c.point - a.point;
        const Vector n = cross(u, v);
        const Vector w = point - a.point;

        const double gam = dot(cross(u, w), n) / squared_norm(n);
        const double bet = dot(cross(w, v), n) / squared_norm(n);
        const double alp = 1.0 - gam - bet;

        const double parameter_u = alp * a.parameter_u + bet * b.parameter_u +
            gam * c.parameter_u;
        const double parameter_v = alp * a.parameter_v + bet * b.parameter_v +
            gam * c.parameter_v;

        const Vector closest_point =
            m_surface->point_at(parameter_u, parameter_v);

        return {parameter_u, parameter_v, closest_point};
    }